

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

void __thiscall internalJSONNode::preparse(internalJSONNode *this)

{
  bool bVar1;
  JSONNode **ppJVar2;
  JSONNode **myrunner_end;
  JSONNode **myrunner;
  internalJSONNode *this_local;
  
  Fetch(this);
  bVar1 = isContainer(this);
  if (bVar1) {
    myrunner_end = jsonChildren::begin(this->Children);
    ppJVar2 = jsonChildren::end(this->Children);
    for (; myrunner_end != ppJVar2; myrunner_end = myrunner_end + 1) {
      ::JSONNode::preparse(*myrunner_end);
    }
  }
  return;
}

Assistant:

void internalJSONNode::preparse(void) json_nothrow {
	   Fetch();
	   if (isContainer()){
		  json_foreach(CHILDREN, myrunner){
			 (*myrunner) -> preparse();
		  }
	   }
    }